

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_close_twice_open_filename.c
# Opt level: O3

void test_archive_read_close_twice_open_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *pcVar3;
  
  a = (archive_conflict *)archive_read_new();
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'!',"empty.file",L'Ƥ',L'\xffffffff',"");
  iVar1 = archive_read_support_format_empty((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_empty(a)",
                      (void *)0x0);
  wVar2 = archive_read_open_filename(a,"empty.file",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'#',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, filename, 0)",
                      (void *)0x0);
  iVar1 = archive_errno((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'$',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L'%',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'(',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L')',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L',',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar3 = archive_error_string((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
             ,L'-',(char *)0x0,"NULL",pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_close_twice_open_filename.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_close_twice_open_filename)
{
	const char *filename = "empty.file";
	struct archive* a = archive_read_new();

	assertMakeFile(filename, 0644, "");
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_empty(a));
	assertEqualInt(ARCHIVE_OK, archive_read_open_filename(a, filename, 0));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}